

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O2

FString __thiscall FluidSynthMIDIDevice::GetStats(FluidSynthMIDIDevice *this)

{
  uint uVar1;
  uint uVar2;
  _func_int_fluid_synth_t_ptr *p_Var3;
  _func_double_fluid_synth_t_ptr *p_Var4;
  _func_int_fluid_settings_t_ptr_char_ptr_char_ptr_ptr *p_Var5;
  _func_int_fluid_settings_t_ptr_char_ptr_int_ptr *p_Var6;
  long in_RSI;
  int maxpoly;
  char *reverb;
  char *chorus;
  uint local_44;
  double local_40;
  char *local_38;
  char *local_30;
  
  if ((*(long *)(in_RSI + 0x68) == 0) || (*(long *)(in_RSI + 0x60) == 0)) {
    FString::FString((FString *)this,"FluidSynth is invalid");
  }
  else {
    (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice = (_func_int **)0x71deec;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    FCriticalSection::Enter((FCriticalSection *)(in_RSI + 8));
    p_Var3 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_get_polyphony);
    uVar1 = (*p_Var3)(*(fluid_synth_t **)(in_RSI + 0x68));
    p_Var3 = TReqProc::operator_cast_to_function_pointer
                       ((TReqProc *)&fluid_synth_get_active_voice_count);
    uVar2 = (*p_Var3)(*(fluid_synth_t **)(in_RSI + 0x68));
    p_Var4 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_get_cpu_load);
    local_40 = (*p_Var4)(*(fluid_synth_t **)(in_RSI + 0x68));
    p_Var5 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_getstr);
    (*p_Var5)(*(fluid_settings_t **)(in_RSI + 0x60),"synth.chorus.active",&local_30);
    p_Var5 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_getstr);
    (*p_Var5)(*(fluid_settings_t **)(in_RSI + 0x60),"synth.reverb.active",&local_38);
    p_Var6 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_getint);
    (*p_Var6)(*(fluid_settings_t **)(in_RSI + 0x60),"synth.polyphony",(int *)&local_44);
    FCriticalSection::Leave((FCriticalSection *)(in_RSI + 8));
    FString::Format((FString *)this,
                    "Voices: \x1cK%3d\x1c-/\x1cI%3d\x1c-(\x1cG%3d\x1c-)\x1cK%6.2f\x1c-%% CPU   Reverb: \x1cK%3s\x1c- Chorus: \x1cK%3s"
                    ,local_40,(ulong)uVar2,(ulong)uVar1,(ulong)local_44,local_38,local_30);
  }
  return (FString)(char *)this;
}

Assistant:

FString FluidSynthMIDIDevice::GetStats()
{
	if (FluidSynth == NULL || FluidSettings == NULL)
	{
		return "FluidSynth is invalid";
	}
	FString out;

	CritSec.Enter();
	int polyphony = fluid_synth_get_polyphony(FluidSynth);
	int voices = fluid_synth_get_active_voice_count(FluidSynth);
	double load = fluid_synth_get_cpu_load(FluidSynth);
	char *chorus, *reverb;
	int maxpoly;
	fluid_settings_getstr(FluidSettings, "synth.chorus.active", &chorus);
	fluid_settings_getstr(FluidSettings, "synth.reverb.active", &reverb);
	fluid_settings_getint(FluidSettings, "synth.polyphony", &maxpoly);
	CritSec.Leave();

	out.Format("Voices: " TEXTCOLOR_YELLOW "%3d" TEXTCOLOR_NORMAL "/" TEXTCOLOR_ORANGE "%3d" TEXTCOLOR_NORMAL "(" TEXTCOLOR_RED "%3d" TEXTCOLOR_NORMAL ")"
			   TEXTCOLOR_YELLOW "%6.2f" TEXTCOLOR_NORMAL "%% CPU   "
			   "Reverb: " TEXTCOLOR_YELLOW "%3s" TEXTCOLOR_NORMAL
			   " Chorus: " TEXTCOLOR_YELLOW "%3s",
		voices, polyphony, maxpoly, load, reverb, chorus);
	return out;
}